

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::DoubleReader,mp::NLHandler<mp::NullNLHandler<int>,int>::DblSuffixHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *this,int num_values,
          int num_items,DblSuffixHandler *handler)

{
  DoubleReader *in_RCX;
  int in_ESI;
  int index;
  int i;
  DoubleReader read;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  DoubleReader *this_00;
  uint in_stack_ffffffffffffffdc;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe4;
  
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffdc =
         NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::ReadUInt
                   ((NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *)
                    CONCAT44(in_stack_ffffffffffffffe4,iVar1),in_stack_ffffffffffffffdc);
    this_00 = in_RCX;
    NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::DoubleReader::operator()
              (in_RCX,(TextReader<fmt::Locale> *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    NLHandler<mp::NullNLHandler<int>,_int>::DblSuffixHandler::SetValue
              ((DblSuffixHandler *)this_00,in_stack_ffffffffffffffbc,1.23744472162432e-317);
    TextReader<fmt::Locale>::ReadTillEndOfLine
              ((TextReader<fmt::Locale> *)CONCAT44(in_stack_ffffffffffffffe4,iVar1));
  }
  return;
}

Assistant:

void ReadSuffixValues(int num_values, int num_items, SuffixHandler &handler) {
    ValueReader read;
    for (int i = 0; i < num_values; ++i) {
      int index = ReadUInt(num_items);
      handler.SetValue(index, read(reader_));
      reader_.ReadTillEndOfLine();
    }
  }